

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_huffman_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_encoding cVar1;
  cram_codec *pcVar2;
  byte bVar3;
  int iVar5;
  int iVar6;
  ulong uVar7;
  byte *__src;
  size_t __n;
  uchar *puVar8;
  cram_codec *pcVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  byte bVar16;
  ulong uVar14;
  size_t sVar15;
  long lVar17;
  byte *pbVar18;
  size_t sVar19;
  size_t __size;
  uint *puVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  byte bVar4;
  
  pcVar2 = (c->field_6).byte_array_len.len_codec;
  uVar7 = (ulong)(c->field_6).e_huffman.nvals;
  __src = (byte *)malloc(uVar7 * 6 + 0x10);
  if (__src == (byte *)0x0) {
    return -1;
  }
  if (prefix == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(prefix);
    puVar8 = b->data;
    uVar7 = b->alloc;
    sVar15 = b->byte;
    if (uVar7 <= sVar15 + __n) {
      do {
        auVar21._8_4_ = (int)(uVar7 >> 0x20);
        auVar21._0_8_ = uVar7;
        auVar21._12_4_ = 0x45300000;
        dVar23 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
        uVar14 = (ulong)dVar23;
        sVar19 = (long)(dVar23 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
        if (uVar7 == 0) {
          sVar19 = 0x400;
        }
        b->alloc = sVar19;
        puVar8 = (uchar *)realloc(puVar8,sVar19);
        b->data = puVar8;
        uVar7 = b->alloc;
        sVar15 = b->byte;
      } while (uVar7 <= sVar15 + __n);
    }
    memcpy(puVar8 + sVar15,prefix,__n);
    b->byte = b->byte + __n;
    uVar7 = (ulong)(uint)(c->field_6).e_huffman.nvals;
  }
  uVar13 = (uint)uVar7;
  bVar11 = (byte)uVar7;
  bVar16 = (byte)(uVar7 >> 8);
  bVar3 = (byte)(uVar7 >> 0x18);
  bVar4 = (byte)(uVar7 >> 0x10);
  if (uVar13 < 0x80) {
    *__src = bVar11;
    lVar17 = 1;
LAB_00153ab9:
    pbVar18 = __src + lVar17;
    if ((int)uVar13 < 1) goto LAB_00153bf1;
  }
  else {
    if (uVar13 < 0x4000) {
      *__src = bVar16 | 0x80;
      lVar10 = 2;
      lVar17 = 1;
    }
    else if (uVar13 < 0x200000) {
      *__src = bVar4 | 0xc0;
      __src[1] = bVar16;
      lVar10 = 3;
      lVar17 = 2;
    }
    else {
      if (0xfffffff < uVar13) {
        *__src = bVar3 >> 4 | 0xf0;
        __src[1] = (byte)(uVar7 >> 0x14);
        __src[2] = (byte)(uVar7 >> 0xc);
        __src[3] = (byte)(uVar7 >> 4);
        __src[4] = bVar11 & 0xf;
        lVar17 = 5;
        goto LAB_00153ab9;
      }
      *__src = bVar3 | 0xe0;
      __src[1] = bVar4;
      __src[2] = bVar16;
      lVar10 = 4;
      lVar17 = 3;
    }
    __src[lVar17] = bVar11;
    pbVar18 = __src + lVar10;
  }
  uVar14 = uVar7 & 0xffffffff;
  pcVar9 = pcVar2;
  do {
    cVar1 = pcVar9->codec;
    if (cVar1 < 0x80) {
      *pbVar18 = (byte)cVar1;
      lVar17 = 1;
    }
    else if (cVar1 < 0x4000) {
      *pbVar18 = (byte)(cVar1 >> 8) | 0x80;
      pbVar18[1] = (char)pcVar9->codec;
      lVar17 = 2;
    }
    else if (cVar1 < 0x200000) {
      *pbVar18 = (byte)(cVar1 >> 0x10) | 0xc0;
      pbVar18[1] = *(byte *)((long)&pcVar9->codec + 1);
      pbVar18[2] = (char)pcVar9->codec;
      lVar17 = 3;
    }
    else {
      bVar12 = (byte)(cVar1 >> 0x18);
      if (cVar1 < 0x10000000) {
        *pbVar18 = bVar12 | 0xe0;
        pbVar18[1] = *(byte *)((long)&pcVar9->codec + 2);
        pbVar18[2] = *(byte *)((long)&pcVar9->codec + 1);
        pbVar18[3] = (char)pcVar9->codec;
        lVar17 = 4;
      }
      else {
        *pbVar18 = bVar12 >> 4 | 0xf0;
        pbVar18[1] = (byte)(pcVar9->codec >> 0x14);
        pbVar18[2] = (byte)(pcVar9->codec >> 0xc);
        pbVar18[3] = (byte)(pcVar9->codec >> 4);
        pbVar18[4] = (char)pcVar9->codec & (E_GOLOMB_RICE|E_SUBEXP);
        lVar17 = 5;
      }
    }
    pbVar18 = pbVar18 + lVar17;
    pcVar9 = (cram_codec *)&pcVar9->free;
    uVar14 = uVar14 - 1;
  } while (uVar14 != 0);
LAB_00153bf1:
  if (uVar13 < 0x80) {
    *pbVar18 = bVar11;
    lVar17 = 1;
  }
  else if (uVar13 < 0x4000) {
    *pbVar18 = bVar16 | 0x80;
    pbVar18[1] = bVar11;
    lVar17 = 2;
  }
  else if (uVar13 < 0x200000) {
    *pbVar18 = bVar4 | 0xc0;
    pbVar18[1] = bVar16;
    pbVar18[2] = bVar11;
    lVar17 = 3;
  }
  else if (uVar13 < 0x10000000) {
    *pbVar18 = bVar3 | 0xe0;
    pbVar18[1] = bVar4;
    pbVar18[2] = bVar16;
    pbVar18[3] = bVar11;
    lVar17 = 4;
  }
  else {
    *pbVar18 = bVar3 >> 4 | 0xf0;
    pbVar18[1] = (byte)(uVar7 >> 0x14);
    pbVar18[2] = (byte)(uVar7 >> 0xc);
    pbVar18[3] = (byte)(uVar7 >> 4);
    pbVar18[4] = bVar11 & 0xf;
    lVar17 = 5;
  }
  pbVar18 = pbVar18 + lVar17;
  if (0 < (c->field_6).e_huffman.nvals) {
    puVar20 = (uint *)((long)&pcVar2->out + 4);
    lVar17 = 0;
    do {
      uVar13 = *puVar20;
      if (uVar13 < 0x80) {
        *pbVar18 = (byte)uVar13;
        lVar10 = 1;
      }
      else if (uVar13 < 0x4000) {
        *pbVar18 = (byte)(uVar13 >> 8) | 0x80;
        pbVar18[1] = (byte)*puVar20;
        lVar10 = 2;
      }
      else if (uVar13 < 0x200000) {
        *pbVar18 = (byte)(uVar13 >> 0x10) | 0xc0;
        pbVar18[1] = *(byte *)((long)puVar20 + 1);
        pbVar18[2] = (byte)*puVar20;
        lVar10 = 3;
      }
      else {
        bVar3 = (byte)(uVar13 >> 0x18);
        if (uVar13 < 0x10000000) {
          *pbVar18 = bVar3 | 0xe0;
          pbVar18[1] = *(byte *)((long)puVar20 + 2);
          pbVar18[2] = *(byte *)((long)puVar20 + 1);
          pbVar18[3] = (byte)*puVar20;
          lVar10 = 4;
        }
        else {
          *pbVar18 = bVar3 >> 4 | 0xf0;
          pbVar18[1] = (byte)(*puVar20 >> 0x14);
          pbVar18[2] = (byte)(*puVar20 >> 0xc);
          pbVar18[3] = (byte)(*puVar20 >> 4);
          pbVar18[4] = (byte)*puVar20 & 0xf;
          lVar10 = 5;
        }
      }
      pbVar18 = pbVar18 + lVar10;
      lVar17 = lVar17 + 1;
      puVar20 = puVar20 + 4;
    } while (lVar17 < (c->field_6).e_huffman.nvals);
  }
  iVar5 = itf8_put_blk(b,c->codec);
  sVar19 = (long)pbVar18 - (long)__src;
  iVar6 = itf8_put_blk(b,(int)sVar19);
  puVar8 = b->data;
  uVar7 = b->alloc;
  sVar15 = b->byte;
  if (uVar7 <= sVar15 + sVar19) {
    do {
      auVar22._8_4_ = (int)(uVar7 >> 0x20);
      auVar22._0_8_ = uVar7;
      auVar22._12_4_ = 0x45300000;
      dVar23 = ((auVar22._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0)) * 1.5;
      uVar14 = (ulong)dVar23;
      __size = (long)(dVar23 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14;
      if (uVar7 == 0) {
        __size = 0x400;
      }
      b->alloc = __size;
      puVar8 = (uchar *)realloc(puVar8,__size);
      b->data = puVar8;
      uVar7 = b->alloc;
      sVar15 = b->byte;
    } while (uVar7 <= sVar15 + sVar19);
  }
  memcpy(puVar8 + sVar15,__src,sVar19);
  b->byte = b->byte + sVar19;
  free(__src);
  return iVar5 + iVar6 + (int)__n + (int)sVar19;
}

Assistant:

int cram_huffman_encode_store(cram_codec *c, cram_block *b, char *prefix,
			      int version) {
    int i, len = 0;
    cram_huffman_code *codes = c->e_huffman.codes;
    /*
     * Up to code length 127 means 2.5e+26 bytes of data required (worst
     * case huffman tree needs symbols with freqs matching the Fibonacci
     * series). So guaranteed 1 byte per code.
     *
     * Symbols themselves could be 5 bytes (eg -1 is 5 bytes in itf8).
     *
     * Therefore 6*ncodes + 5 + 5 + 1 + 5 is max memory
     */
    char *tmp = malloc(6*c->e_huffman.nvals+16);
    char *tp = tmp;

    if (!tmp)
	return -1;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].symbol);
    }

    tp += itf8_put(tp, c->e_huffman.nvals);
    for (i = 0; i < c->e_huffman.nvals; i++) {
	tp += itf8_put(tp, codes[i].len);
    }

    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, tp-tmp);
    BLOCK_APPEND(b, tmp, tp-tmp);
    len += tp-tmp;

    free(tmp);

    return len;
}